

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall PPointer::ReadValue(PPointer *this,FArchive *ar,void *addr)

{
  PType *pPVar1;
  PClass *pPVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  PClass *pPVar4;
  bool bVar5;
  BYTE tag;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  FArchive::operator<<(ar,&local_21);
  pPVar2 = PClass::RegistrationInfo.MyClass;
  if (local_21 == 0x10) {
    pPVar1 = this->PointedType;
    if ((pPVar1->super_DObject).Class == (PClass *)0x0) {
      iVar3 = (**(pPVar1->super_DObject)._vptr_DObject)(pPVar1);
      (pPVar1->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pPVar4 = (pPVar1->super_DObject).Class;
    bVar5 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar5) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar5 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (bVar5) {
      FArchive::ReadObject(ar,(DObject **)addr,DObject::RegistrationInfo.MyClass);
      return true;
    }
  }
  PType::SkipValue(ar,(uint)local_21);
  return false;
}

Assistant:

bool PPointer::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	if (tag == VAL_Object && PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		ar << *(DObject **)addr;
		return true;
	}
	SkipValue(ar, tag);
	return false;
}